

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O2

int AF_DBlockThingsIterator_Next
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  DBlockThingsIterator *this;
  bool bVar1;
  int iVar2;
  char *__assertion;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
  }
  else if (((param->field_0).field_3.Type == '\x03') && ((param->field_0).field_1.atag == 1)) {
    this = (DBlockThingsIterator *)(param->field_0).field_1.a;
    bVar1 = DObject::IsKindOf((DObject *)this,DBlockThingsIterator::RegistrationInfo.MyClass);
    if (bVar1) {
      bVar1 = DBlockThingsIterator::Next(this);
      if (numret < 1) {
        iVar2 = 0;
      }
      else {
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                        ,0x4cd,
                        "int AF_DBlockThingsIterator_Next(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        VMReturn::SetInt(ret,(uint)bVar1);
        iVar2 = 1;
      }
      return iVar2;
    }
    __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(DBlockThingsIterator))";
  }
  else {
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                ,0x4cc,
                "int AF_DBlockThingsIterator_Next(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(DBlockThingsIterator, Next)
{
	PARAM_SELF_PROLOGUE(DBlockThingsIterator);
	ACTION_RETURN_BOOL(self->Next());
}